

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diff_value.hpp
# Opt level: O0

value_ptr __thiscall
pstore::diff_dump::
make_diff<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>,std::shared_ptr<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>(*)(pstore::database&,bool)>
          (diff_dump *this,database *db,revision_number old_revision,
          _func_shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_database_ptr_bool
          *get_index)

{
  __shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
  *this_00;
  element_type *t;
  element_type *index_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  value_ptr vVar1;
  not_null<pstore::diff_dump::details::diff_out<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>::params_*>
  local_b0;
  diff_out<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  local_a8;
  not_null<std::vector<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>_*>
  local_a0;
  not_null<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_*>
  local_98;
  not_null<const_pstore::database_*> local_90;
  undefined1 local_88 [8];
  params params;
  undefined1 local_60 [24];
  shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  index;
  container members;
  _func_shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>_database_ptr_bool
  *get_index_local;
  revision_number old_revision_local;
  database *db_local;
  
  std::
  vector<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
  ::vector((vector<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
            *)&index.
               super___shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount);
  (*get_index)((database *)local_60,SUB81(db,0));
  this_00 = (__shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
             *)(local_60 + 0x10);
  std::
  shared_ptr<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>const>
  ::
  shared_ptr<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>,void>
            ((shared_ptr<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>const>
              *)this_00,
             (shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
              *)local_60);
  std::
  shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  ::~shared_ptr((shared_ptr<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
                 *)local_60);
  gsl::not_null<const_pstore::database_*>::not_null(&local_90,db);
  t = std::
      __shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
      ::get(this_00);
  gsl::
  not_null<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_*>
  ::not_null(&local_98,t);
  gsl::
  not_null<std::vector<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>_*>
  ::not_null(&local_a0,
             (vector<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
              *)&index.
                 super___shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount);
  details::
  diff_out<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  ::params::params((params *)local_88,local_90,local_98,local_a0);
  index_00 = std::
             __shared_ptr_access<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this_00);
  gsl::
  not_null<pstore::diff_dump::details::diff_out<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>::params_*>
  ::not_null(&local_b0,(params *)local_88);
  details::
  diff_out<pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  ::diff_out(&local_a8,local_b0);
  diff<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>,pstore::diff_dump::details::diff_out<pstore::index::hamt_map<pstore::uint128,pstore::extent<pstore::repo::compilation>,pstore::index::u128_hash,std::equal_to<pstore::uint128>>>>
            (db,index_00,old_revision,local_a8);
  dump::make_value((dump *)this,
                   (container *)
                   &index.
                    super___shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount);
  std::
  shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
  ::~shared_ptr((shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>_>
                 *)(local_60 + 0x10));
  std::
  vector<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
  ::~vector((vector<std::shared_ptr<pstore::dump::value>,_std::allocator<std::shared_ptr<pstore::dump::value>_>_>
             *)&index.
                super___shared_ptr<const_pstore::index::hamt_map<pstore::uint128,_pstore::extent<pstore::repo::compilation>,_pstore::index::u128_hash,_std::equal_to<pstore::uint128>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  vVar1.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  vVar1.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (value_ptr)vVar1.super___shared_ptr<pstore::dump::value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

dump::value_ptr make_diff (database & db, revision_number const old_revision,
                                   GetIndexFunction get_index) {
            dump::array::container members;
            std::shared_ptr<Index const> const index = get_index (db, true /* create */);
            typename details::diff_out<Index>::params params{&db, index.get (), &members};
            diff (db, *index, old_revision, details::diff_out<Index>{&params});
            return dump::make_value (members);
        }